

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_type.cpp
# Opt level: O2

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseType
          (Parser *this,
          unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *caps)

{
  pointer puVar1;
  Capabilities *__args_1;
  undefined8 uVar2;
  bool bVar3;
  long lVar4;
  Token **in_RDX;
  pointer *__ptr;
  Parser *this_00;
  Lexer *local_98;
  undefined1 local_90 [16];
  undefined1 local_80 [32];
  __uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_> _Stack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined1 local_48 [16];
  
  puVar1 = (caps->_M_t).
           super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
           ._M_t.
           super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
           .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl[3].required.
           super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_80._24_8_ =
       puVar1[3]._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>;
  _Stack_60._M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       puVar1[4]._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t
  ;
  local_58._M_allocated_capacity =
       (size_type)
       puVar1[5]._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>;
  sanityExpect((Parser *)caps,TOK_KW_TYPE);
  parseExpression((Parser *)(local_90 + 8),(Precedence)caps);
  if ((Expr *)local_90._8_8_ == (Expr *)0x0) {
    local_98 = (Lexer *)CONCAT62(local_98._2_6_,2);
    local_90._0_4_ = 0x1f;
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)local_80,(SyntaxErrorCode *)&local_98,(Position *)local_90);
    this_00 = (Parser *)&stack0xffffffffffffffc8;
  }
  else {
    bVar3 = isBiOpExpr((Expr *)local_90._8_8_,TOK_OP_NONE);
    uVar2 = local_90._8_8_;
    if (bVar3) {
      if (*(_func_int ***)local_90._8_8_ != (_func_int **)&PTR__BiOpExpr_00128998) {
LAB_00116772:
        __cxa_bad_cast();
      }
      bVar3 = isTokenExpr(*(Expr **)&((Expr *)(local_90._8_8_ + 0x38))->type,TOK_ID);
      if (bVar3) {
        Position::operator+((Position *)(local_80 + 0x18),(Position *)(uVar2 + 0x20));
        local_58._M_allocated_capacity = local_80._16_8_;
        local_80._24_8_ = local_80._0_8_;
        _Stack_60._M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
        super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl._4_4_ = local_80._12_4_;
        _Stack_60._M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
        super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl._0_4_ = local_80._8_4_;
        __args_1 = (caps->_M_t).
                   super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                   .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl;
        lVar4 = __dynamic_cast(*(undefined8 *)&((Expr *)(uVar2 + 0x38))->type,&Expr::typeinfo,
                               &TokenExpr::typeinfo,0);
        if (lVar4 == 0) goto LAB_00116772;
        local_90._0_8_ = *(undefined8 *)(lVar4 + 0x38);
        local_98 = ((Expr *)(uVar2 + 0x38))->lexer;
        ((Expr *)(uVar2 + 0x38))->lexer = (Lexer *)0x0;
        std::
        make_unique<pfederc::TypeExpr,pfederc::Lexer&,pfederc::Position&,std::unique_ptr<pfederc::Capabilities,std::default_delete<pfederc::Capabilities>>,pfederc::Token_const*,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>
                  ((Lexer *)local_80,(Position *)__args_1,
                   (unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *
                   )(local_80 + 0x18),in_RDX,
                   (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_90);
        uVar2 = local_80._0_8_;
        local_80._0_8_ = (Lexer *)0x0;
        this->lexer = (Lexer *)uVar2;
        std::unique_ptr<pfederc::TypeExpr,_std::default_delete<pfederc::TypeExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::TypeExpr,_std::default_delete<pfederc::TypeExpr>_> *)
                   local_80);
        if (local_98 != (Lexer *)0x0) {
          (*local_98->_vptr_Lexer[1])();
        }
        goto LAB_00116750;
      }
      local_98 = (Lexer *)CONCAT62(local_98._2_6_,2);
      local_90._0_4_ = 8;
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)local_80,(SyntaxErrorCode *)&local_98,(Position *)local_90);
      this_00 = (Parser *)local_48;
    }
    else {
      local_98 = (Lexer *)CONCAT62(local_98._2_6_,2);
      local_90._0_4_ = 0x1f;
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)local_80,(SyntaxErrorCode *)&local_98,(Position *)local_90);
      this_00 = (Parser *)(local_48 + 8);
    }
  }
  generateError(this_00,(unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)caps);
  std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
            ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)this_00);
  std::
  unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
  ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                 *)local_80);
  this->lexer = (Lexer *)0x0;
LAB_00116750:
  if ((Expr *)local_90._8_8_ != (Expr *)0x0) {
    (*(*(_func_int ***)local_90._8_8_)[1])();
  }
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseType(std::unique_ptr<Capabilities> &&caps) noexcept {
  Position pos(lexer.getCurrentToken()->getPosition());
  sanityExpect(TokenType::TOK_KW_TYPE);

  std::unique_ptr<Expr> expr(parseExpression());
  if (!expr) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_INVALID_TYPE_EXPR, lexer.getCurrentToken()->getPosition()));
    return nullptr;
  }

  if (!isBiOpExpr(*expr, TokenType::TOK_OP_NONE)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_INVALID_TYPE_EXPR, expr->getPosition()));
    return nullptr;
  }

  BiOpExpr &biopexpr = dynamic_cast<BiOpExpr&>(*expr);

  if (!isTokenExpr(biopexpr.getRight(), TokenType::TOK_ID)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_ID, biopexpr.getRight().getPosition()));
    return nullptr;
  }

  pos = pos + biopexpr.getPosition();

  return std::make_unique<TypeExpr>(lexer, pos, std::move(caps),
      dynamic_cast<const TokenExpr&>(biopexpr.getRight()).getTokenPtr(),
      biopexpr.getLeftPtr());
}